

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O3

int __thiscall CASC_CSV::GetBinary(CASC_CSV *this,LPBYTE pbBuffer,size_t nMaxBytes,size_t Index)

{
  size_t nMaxDigits;
  int iVar1;
  
  if (Index < this->nColumns) {
    nMaxDigits = this->Columns[Index].nLength;
    if (nMaxDigits == nMaxBytes * 2) {
      iVar1 = ConvertStringToBinary(this->Columns[Index].szString,nMaxDigits,pbBuffer);
      return iVar1;
    }
  }
  return 0x69;
}

Assistant:

int CASC_CSV::GetBinary(LPBYTE pbBuffer, size_t nMaxBytes, size_t Index)
{
    // Check for index overflow and buffer overflow
    if (Index >= nColumns)
        return ERROR_INSUFFICIENT_BUFFER;
    if (Columns[Index].nLength != nMaxBytes * 2)
        return ERROR_INSUFFICIENT_BUFFER;

    // Convert the string to binary
    return ConvertStringToBinary(Columns[Index].szString, nMaxBytes * 2, pbBuffer);
}